

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O3

void __thiscall
Js::CompoundString::
AppendChars<unsigned_short,Js::DateImplementation::GetDateGmtString(PlatformAgnostic::DateTime::YMD*,Js::ScriptContext*)::__0>
          (CompoundString *this,uint16 *value)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  CharCount CVar4;
  charcount_t cVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  size_t sVar8;
  char16_t *pcVar9;
  char16_t *outBuffer;
  uint appendCharLength;
  char16_t local_68 [4];
  char16 localConvertBuffer [21];
  
  pcVar6 = JavascriptString::UnsafeGetBuffer((JavascriptString *)this);
  if (pcVar6 != (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ed,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar2) goto LAB_00b3c04f;
    *puVar7 = 0;
  }
  bVar2 = OwnsLastBlock(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ee,"(toString->OwnsLastBlock())","toString->OwnsLastBlock()");
    if (!bVar2) goto LAB_00b3c04f;
    *puVar7 = 0;
  }
  bVar2 = HasOnlyDirectChars(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x4ef,"(!(appendChars && !toString->HasOnlyDirectChars()))",
                                "!(appendChars && !toString->HasOnlyDirectChars())");
    if (!bVar2) goto LAB_00b3c04f;
    *puVar7 = 0;
  }
  CVar3 = LastBlockCharLength(this);
  CVar4 = LastBlockCharCapacity(this);
  if (CVar4 - CVar3 < 3) {
    outBuffer = local_68;
  }
  else {
    pcVar6 = LastBlockChars(this);
    outBuffer = pcVar6 + CVar3;
  }
  cVar5 = NumberUtilities::UInt16ToString(*value,outBuffer,3,'\x02');
  if (cVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x172,"(cchWritten != 0)","cchWritten != 0");
    if (!bVar2) goto LAB_00b3c04f;
    *puVar7 = 0;
  }
  sVar8 = PAL_wcslen(outBuffer);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,StringConcatPhase);
  appendCharLength = (uint)sVar8;
  if (bVar2) {
    pcVar9 = L"";
    if (8 < appendCharLength) {
      pcVar9 = L"...";
    }
    Output::Print(L"CompoundString::AppendGeneric(TValue &, appendChars = %s) - converted = \"%.8s%s\", appendCharLength = %u\n"
                  ,L"true",outBuffer,pcVar9,sVar8 & 0xffffffff);
    Output::Flush();
  }
  if (CVar4 - CVar3 < 3) {
    if (outBuffer != local_68) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                  ,0x50c,"(convertBuffer == localConvertBuffer)",
                                  "convertBuffer == localConvertBuffer");
      if (!bVar2) {
LAB_00b3c04f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    AppendGeneric<Js::CompoundString>(local_68,appendCharLength,this,true);
  }
  else {
    cVar5 = JavascriptString::GetLength((JavascriptString *)this);
    JavascriptString::SetLength((JavascriptString *)this,cVar5 + appendCharLength);
    SetLastBlockCharLength(this,CVar3 + appendCharLength);
  }
  return;
}

Assistant:

inline void CompoundString::AppendChars(
        const TValue &value,
        const CharCount maximumAppendCharLength,
        const FConvertToString ConvertToString)
    {
        AppendGeneric(value, maximumAppendCharLength, ConvertToString, this, true);
    }